

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBCellFlag.cpp
# Opt level: O1

int __thiscall amrex::EBCellFlagFab::getNumCoveredCells(EBCellFlagFab *this,Box *bx_in)

{
  Box *pBVar1;
  int *piVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  iterator iVar7;
  int i;
  long lVar8;
  long lVar9;
  long lVar10;
  Box bx;
  key_type local_b8;
  NumCells local_9c;
  pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells> local_88;
  Array4<const_amrex::EBCellFlag> local_58;
  
  iVar6 = *(int *)&(this->super_BaseFab<amrex::EBCellFlag>).field_0x44;
  uVar3 = *(undefined8 *)(bx_in->smallend).vect;
  uVar4 = *(undefined8 *)((bx_in->smallend).vect + 2);
  uVar5 = *(undefined8 *)((bx_in->bigend).vect + 2);
  local_b8.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx_in->bigend).vect >> 0x20);
  local_b8.bigend.vect[2] = (int)uVar5;
  local_b8.btype.itype = (uint)((ulong)uVar5 >> 0x20);
  local_b8.smallend.vect[0] = (int)uVar3;
  local_b8.smallend.vect[1] = (int)((ulong)uVar3 >> 0x20);
  local_b8.smallend.vect[2] = (int)uVar4;
  local_b8.bigend.vect[0] = (int)((ulong)uVar4 >> 0x20);
  lVar8 = 0;
  do {
    if ((local_b8.btype.itype >> ((uint)lVar8 & 0x1f) & 1) != 0) {
      piVar2 = local_b8.bigend.vect + lVar8;
      *piVar2 = *piVar2 + -1;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  local_b8.btype.itype = 0;
  if (iVar6 != 0) {
    if (iVar6 == -1) {
      iVar6 = ((local_b8.bigend.vect[2] - local_b8.smallend.vect[2]) + 1) *
              ((local_b8.bigend.vect[1] - local_b8.smallend.vect[1]) + 1) *
              ((local_b8.bigend.vect[0] - local_b8.smallend.vect[0]) + 1);
    }
    else {
      iVar7 = std::
              _Rb_tree<amrex::Box,_std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>,_std::_Select1st<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>,_std::less<amrex::Box>,_std::allocator<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>_>
              ::find(&(this->m_typemap)._M_t,&local_b8);
      if ((_Rb_tree_header *)iVar7._M_node == &(this->m_typemap)._M_t._M_impl.super__Rb_tree_header)
      {
        local_58.p = (this->super_BaseFab<amrex::EBCellFlag>).dptr;
        local_58.ncomp = (this->super_BaseFab<amrex::EBCellFlag>).nvar;
        pBVar1 = &(this->super_BaseFab<amrex::EBCellFlag>).domain;
        local_58.begin.z = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
        local_58.begin.x = (pBVar1->smallend).vect[0];
        local_58.begin.y = (pBVar1->smallend).vect[1];
        lVar8 = (long)(this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
        lVar9 = (long)(this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
        lVar10 = (long)(this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
        local_58.jstride = (lVar9 - (pBVar1->smallend).vect[0]) + 1;
        local_58.kstride =
             (lVar8 - (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
             local_58.jstride;
        local_58.nstride = (lVar10 - local_58.begin.z) * local_58.kstride;
        local_58.end._0_8_ = lVar9 + 1U & 0xffffffff | lVar8 << 0x20;
        local_58.end.z = (int)lVar10;
        anon_unknown_27::countCells(&local_9c,&local_58,&local_b8);
        local_88.first.btype.itype = local_b8.btype.itype;
        local_88.first.bigend.vect[2] = local_b8.bigend.vect[2];
        local_88.first.bigend.vect[1] = local_b8.bigend.vect[1];
        local_88.first.smallend.vect[1] = local_b8.smallend.vect[1];
        local_88.first.smallend.vect[0] = local_b8.smallend.vect[0];
        local_88.first.smallend.vect[2] = local_b8.smallend.vect[2];
        local_88.first.bigend.vect[0] = local_b8.bigend.vect[0];
        local_88.second.nregular = local_9c.nregular;
        local_88.second.nsingle = local_9c.nsingle;
        local_88.second.type = local_9c.type;
        std::
        _Rb_tree<amrex::Box,std::pair<amrex::Box_const,amrex::EBCellFlagFab::NumCells>,std::_Select1st<std::pair<amrex::Box_const,amrex::EBCellFlagFab::NumCells>>,std::less<amrex::Box>,std::allocator<std::pair<amrex::Box_const,amrex::EBCellFlagFab::NumCells>>>
        ::_M_insert_unique<std::pair<amrex::Box_const,amrex::EBCellFlagFab::NumCells>>
                  ((_Rb_tree<amrex::Box,std::pair<amrex::Box_const,amrex::EBCellFlagFab::NumCells>,std::_Select1st<std::pair<amrex::Box_const,amrex::EBCellFlagFab::NumCells>>,std::less<amrex::Box>,std::allocator<std::pair<amrex::Box_const,amrex::EBCellFlagFab::NumCells>>>
                    *)&this->m_typemap,&local_88);
        iVar6 = local_9c.ncovered;
      }
      else {
        iVar6 = *(int *)&iVar7._M_node[2]._M_parent;
      }
    }
  }
  return iVar6;
}

Assistant:

int
EBCellFlagFab::getNumCoveredCells (const Box& bx_in) const noexcept
{
    FabType thistype = getType();

    const Box& bx = amrex::enclosedCells(bx_in);

    if (thistype == FabType::regular)
    {
        return 0;
    }
    else if (thistype == FabType::covered)
    {
        return static_cast<int>(bx.numPts());
    }
    else
    {
        std::map<Box,NumCells>::iterator it;
#ifdef AMREX_USE_OMP
#pragma omp critical (amrex_ebcellflagfab_gettype)
#endif
        it = m_typemap.find(bx);
        if (it != m_typemap.end())
        {
            return it->second.ncovered;
        }
        else
        {
            auto const& flag = this->const_array();
            auto const& t = countCells(flag, bx);

#ifdef AMREX_USE_OMP
#pragma omp critical (amrex_ebcellflagfab_gettype)
#endif
            m_typemap.insert({bx,t});

            return t.ncovered;
        }
    }
}